

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_swizzle_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  SPIRCombinedImageSampler *pSVar1;
  long lVar2;
  size_type sVar3;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  
  pSVar1 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>((Compiler *)this,id);
  if (pSVar1 != (SPIRCombinedImageSampler *)0x0) {
    id = (pSVar1->image).id;
  }
  CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,id,true);
  lVar2 = ::std::__cxx11::string::find((char)&expr,0x5b);
  for (sVar3 = 0; expr._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    if (expr._M_dataplus._M_p[sVar3] == '.') {
      expr._M_dataplus._M_p[sVar3] = '_';
    }
  }
  if (lVar2 == -1) {
    ::std::operator+(__return_storage_ptr__,&expr,&this->swizzle_name_suffix);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&image_expr,(ulong)&expr);
    ::std::__cxx11::string::substr((ulong)&array_expr,(ulong)&expr);
    ::std::operator+(&local_90,&image_expr,&this->swizzle_name_suffix);
    ::std::operator+(__return_storage_ptr__,&local_90,&array_expr);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&array_expr);
    ::std::__cxx11::string::~string((string *)&image_expr);
  }
  ::std::__cxx11::string::~string((string *)&expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_swizzle_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);

	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	// If an image is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + swizzle_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return image_expr + swizzle_name_suffix + array_expr;
	}
}